

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosStream.cpp
# Opt level: O2

void __thiscall
adiosStream::adiosStream
          (adiosStream *this,string *streamName,IO *io,Mode mode,MPI_Comm comm,bool iotimer,
          size_t appid)

{
  Engine *pEVar1;
  FILE *__stream;
  ostream *poVar2;
  unsigned_long __val;
  long lVar3;
  double dVar4;
  int totalRanks;
  int myRank;
  Engine *local_158;
  double local_150;
  vector<double,_std::allocator<double>_> opentime_all_ranks;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string logfilename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Stream::Stream(&this->super_Stream,streamName,mode);
  (this->super_Stream)._vptr_Stream = (_func_int **)&PTR__adiosStream_00122cb8;
  (this->engine).m_Engine = (Engine *)0x0;
  (this->io).m_IO = io->m_IO;
  this->comm = comm;
  MPI_Comm_rank(comm,&myRank);
  MPI_Comm_size(comm,&totalRanks);
  local_158 = &this->engine;
  this->hasIOTimer = iotimer;
  this->appID = appid;
  if (mode == Write) {
    local_150 = (double)MPI_Wtime();
    pEVar1 = (Engine *)adios2::IO::Open((string *)io,(Mode)streamName,(ompi_communicator_t *)0x1);
    local_158->m_Engine = pEVar1;
    dVar4 = (double)MPI_Wtime();
  }
  else {
    local_150 = (double)MPI_Wtime();
    pEVar1 = (Engine *)adios2::IO::Open((string *)io,(Mode)streamName,(ompi_communicator_t *)0x2);
    local_158->m_Engine = pEVar1;
    dVar4 = (double)MPI_Wtime();
  }
  if (this->hasIOTimer == true) {
    this->openTime = dVar4 - local_150;
    opentime_all_ranks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    opentime_all_ranks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    opentime_all_ranks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (myRank == 0) {
      std::__cxx11::to_string(&local_130,this->appID);
      std::operator+(&local_110,"app",&local_130);
      std::operator+(&logfilename,&local_110,"_perf.csv");
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      __stream = fopen(logfilename._M_dataplus._M_p,"w");
      this->perfLogFP = (FILE *)__stream;
      fputs("step,rank,operation,time\n",__stream);
      poVar2 = std::operator<<((ostream *)&std::cout,"performance log file open succeeded!");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::vector<double,_std::allocator<double>_>::reserve(&opentime_all_ranks,(long)totalRanks);
      std::__cxx11::string::~string((string *)&logfilename);
    }
    MPI_Gather(&this->openTime,1,&ompi_mpi_double,
               opentime_all_ranks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,1,&ompi_mpi_double,0,comm);
    if (myRank == 0) {
      for (lVar3 = 0; lVar3 < totalRanks; lVar3 = lVar3 + 1) {
        __val = adios2::Engine::CurrentStep();
        std::__cxx11::to_string(&local_90,__val);
        std::operator+(&local_d0,&local_90,",");
        std::__cxx11::to_string(&local_b0,(int)lVar3);
        std::operator+(&local_50,&local_d0,&local_b0);
        std::operator+(&local_130,&local_50,",open,");
        std::__cxx11::to_string
                  (&local_70,
                   opentime_all_ranks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar3]);
        std::operator+(&local_110,&local_130,&local_70);
        std::operator+(&logfilename,&local_110,"\n");
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_90);
        fputs(logfilename._M_dataplus._M_p,(FILE *)this->perfLogFP);
        std::__cxx11::string::~string((string *)&logfilename);
      }
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&opentime_all_ranks.super__Vector_base<double,_std::allocator<double>_>);
  }
  return;
}

Assistant:

adiosStream::adiosStream(const std::string &streamName, adios2::IO &io, const adios2::Mode mode,
                         MPI_Comm comm, bool iotimer, size_t appid)
: Stream(streamName, mode), io(io), comm(comm)
{
    int myRank, totalRanks;
    MPI_Comm_rank(comm, &myRank);
    MPI_Comm_size(comm, &totalRanks);
    double timeStart, timeEnd;

    // double maxOpenTime, minOpenTime;
    hasIOTimer = iotimer;
    appID = appid;

    if (mode == adios2::Mode::Write)
    {
        timeStart = MPI_Wtime();
        engine = io.Open(streamName, adios2::Mode::Write, comm);
        timeEnd = MPI_Wtime();
    }
    else
    {
        timeStart = MPI_Wtime();
        engine = io.Open(streamName, adios2::Mode::Read, comm);
        timeEnd = MPI_Wtime();
    }
    if (hasIOTimer)
    {
        openTime = timeEnd - timeStart;
        std::vector<double> opentime_all_ranks;
        if (myRank == 0)
        {
            std::string logfilename = "app" + std::to_string(appID) + "_perf.csv";
            perfLogFP = fopen(logfilename.c_str(), "w");
            fputs("step,rank,operation,time\n", perfLogFP);
            std::cout << "performance log file open succeeded!" << std::endl;
            opentime_all_ranks.reserve(totalRanks);
        }
        MPI_Gather(&openTime, 1, MPI_DOUBLE, opentime_all_ranks.data(), 1, MPI_DOUBLE, 0, comm);
        if (myRank == 0)
        {
            for (int i = 0; i < totalRanks; i++)
            {
                std::string content = std::to_string(engine.CurrentStep()) + "," +
                                      std::to_string(i) + ",open," +
                                      std::to_string(opentime_all_ranks[i]) + "\n";
                // std::cout << content;
                fputs(content.c_str(), perfLogFP);
            }
        }
    }
    // openTime = timeEnd - timeStart;
    // MPI_Allreduce(&openTime, &maxOpenTime, 1, MPI_DOUBLE, MPI_MAX, comm);
    // MPI_Allreduce(&openTime, &minOpenTime, 1, MPI_DOUBLE, MPI_MIN, comm);
    // if (myRank == 0)
    // {
    //     std::cout << "        Max open time = " << maxOpenTime << std::endl;
    //     std::cout << "        Min open time = " << minOpenTime << std::endl;
    //     std::ofstream open_perf_log;
    //     open_perf_log.open("open_perf.txt", std::ios::app);
    //     open_perf_log << std::to_string(maxOpenTime) + ", " +
    //                          std::to_string(minOpenTime) + "\n";
    //     open_perf_log.close();
    // }
}